

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineChart.cpp
# Opt level: O3

void __thiscall chart::createWindow(chart *this,uint x,uint y,string *des)

{
  RenderTarget *this_00;
  Text *this_01;
  locale local_80 [8];
  undefined1 local_78 [12];
  float local_6c;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  local_68;
  VideoMode local_58;
  ContextSettings local_4c;
  
  local_4c.depthBits = 0;
  local_4c.stencilBits = 0;
  local_4c.antialiasingLevel = 3;
  local_4c.majorVersion = 1;
  local_4c.minorVersion = 1;
  local_4c.attributeFlags = 0;
  local_4c.sRgbCapable = false;
  sf::VideoMode::VideoMode(&local_58,x,y,0x20);
  std::locale::locale(local_80);
  sf::String::String((String *)local_78,des,local_80);
  sf::Window::create((Window *)this,local_58,(String *)local_78,1,&local_4c);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale(local_80);
  local_78._8_4_ = (undefined4)x;
  local_6c = (float)y;
  local_78._0_8_ = (pointer)0xc1a00000;
  sf::View::reset(&this->view,(FloatRect *)local_78);
  this_00 = &(this->window).super_RenderTarget;
  sf::RenderTarget::setView(this_00,&this->view);
  sf::RenderTarget::clear(this_00,(Color *)&sf::Color::Black);
  sf::Window::display((Window *)this);
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Roboto-Regular.ttf","");
  sf::Font::loadFromFile(&this->font,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  this_01 = &this->text;
  sf::Text::setFont(this_01,&this->font);
  std::locale::locale(local_80);
  sf::String::String((String *)local_78,"0",local_80);
  sf::Text::setString(this_01,(String *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale(local_80);
  sf::Text::setCharacterSize(this_01,0xe);
  sf::Text::setFillColor(this_01,(Color *)&sf::Color::White);
  return;
}

Assistant:

void chart::createWindow(unsigned x, unsigned y, std::string des)
{
    sf::ContextSettings settings;
    settings.antialiasingLevel = 3;

    window.create(sf::VideoMode(x, y), des, sf::Style::Default || sf::Style::Close, settings);
    view.reset(sf::FloatRect(-20, 0, x, y));
    window.setView(view);

    window.clear(sf::Color::Black);
    window.display();

    font.loadFromFile("Roboto-Regular.ttf");
    text.setFont(font);
    text.setString("0");
    text.setCharacterSize(14);
    text.setFillColor(sf::Color::White);
}